

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSender.hpp
# Opt level: O1

void __thiscall Statsd::UDPSender::queueMessage(UDPSender *this,string *message)

{
  iterator *piVar1;
  _Elt_pointer pbVar2;
  _Elt_pointer pbVar3;
  _Elt_pointer pbVar4;
  bool bVar5;
  unique_lock<std::mutex> batchingLock;
  unique_lock<std::mutex> local_20;
  
  bVar5 = (this->m_batchingThread)._M_id._M_thread == 0;
  if (bVar5) {
    local_20._M_device = (mutex *)0x0;
  }
  else {
    local_20._M_device = &this->m_batchingMutex;
    local_20._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_20);
  }
  local_20._M_owns = !bVar5;
  pbVar4 = (this->m_batchingMessageQueue).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar4 != (this->m_batchingMessageQueue).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pbVar2 = (this->m_batchingMessageQueue).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    pbVar3 = pbVar4;
    if (pbVar4 == pbVar2) {
      pbVar3 = (this->m_batchingMessageQueue).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    if (pbVar3[-1]._M_string_length <= this->m_batchsize) {
      pbVar3 = pbVar4;
      if (pbVar4 == pbVar2) {
        pbVar3 = (this->m_batchingMessageQueue).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      if (pbVar3[-1]._M_string_length != 0) {
        if (pbVar4 == pbVar2) {
          pbVar4 = (this->m_batchingMessageQueue).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        std::__cxx11::string::push_back((char)pbVar4 + -0x20);
      }
      goto LAB_0010773a;
    }
  }
  if (pbVar4 == (this->m_batchingMessageQueue).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_push_back_aux<>(&this->m_batchingMessageQueue);
  }
  else {
    (pbVar4->_M_dataplus)._M_p = (pointer)&pbVar4->field_2;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    piVar1 = &(this->m_batchingMessageQueue).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  pbVar4 = (this->m_batchingMessageQueue).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar4 == (this->m_batchingMessageQueue).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar4 = (this->m_batchingMessageQueue).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  std::__cxx11::string::reserve((ulong)(pbVar4 + -1));
LAB_0010773a:
  pbVar4 = (this->m_batchingMessageQueue).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar4 == (this->m_batchingMessageQueue).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar4 = (this->m_batchingMessageQueue).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  std::__cxx11::string::_M_append((char *)(pbVar4 + -1),(ulong)(message->_M_dataplus)._M_p);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

inline void UDPSender::queueMessage(const std::string& message) noexcept {
    // We aquire a lock but only if we actually need to (i.e. there is a thread also accessing the queue)
    auto batchingLock =
        m_batchingThread.joinable() ? std::unique_lock<std::mutex>(m_batchingMutex) : std::unique_lock<std::mutex>();
    // Either we don't have a place to batch our message or we exceeded the batch size, so make a new batch
    if (m_batchingMessageQueue.empty() || m_batchingMessageQueue.back().length() > m_batchsize) {
        m_batchingMessageQueue.emplace_back();
        m_batchingMessageQueue.back().reserve(m_batchsize + 256);
    }  // When there is already a batch open we need a separator when its not empty
    else if (!m_batchingMessageQueue.back().empty()) {
        m_batchingMessageQueue.back().push_back('\n');
    }
    // Add the new message to the batch
    m_batchingMessageQueue.back().append(message);
}